

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O0

SpatialForceVector * __thiscall
iDynTree::SpatialMotionVector::cross(SpatialMotionVector *this,SpatialForceVector *other)

{
  LinearVector3T *pLVar1;
  GeomVector3 *this_00;
  AngularVector3T *pAVar2;
  long in_RDX;
  long in_RSI;
  SpatialForceVector *in_RDI;
  SpatialForceVector *res;
  GeomVector3 *in_stack_ffffffffffffff18;
  SpatialForceVector *in_stack_ffffffffffffff20;
  double local_60;
  GeomVector3 *in_stack_ffffffffffffffa8;
  GeomVector3 *in_stack_ffffffffffffffb0;
  double local_38;
  double dStack_30;
  double local_28;
  
  SpatialForceVector::SpatialForceVector(in_stack_ffffffffffffff20);
  SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  GeomVector3::cross(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pLVar1 = SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                     (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>);
  (pLVar1->super_Vector3).m_data[2] = local_28;
  (pLVar1->super_Vector3).m_data[0] = local_38;
  (pLVar1->super_Vector3).m_data[1] = dStack_30;
  SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  GeomVector3::cross(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (GeomVector3 *)(in_RSI + 0x18);
  SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
            ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  GeomVector3::cross(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  GeomVector3::operator+(this_00,in_stack_ffffffffffffff18);
  pAVar2 = SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                     (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>);
  (pAVar2->super_Vector3).m_data[0] = local_60;
  (pAVar2->super_Vector3).m_data[1] = (double)in_stack_ffffffffffffffa8;
  (pAVar2->super_Vector3).m_data[2] = (double)in_stack_ffffffffffffffb0;
  return in_RDI;
}

Assistant:

SpatialForceVector SpatialMotionVector::cross(const SpatialForceVector& other) const
{
    SpatialForceVector res;

    res.getLinearVec3()  = this->angularVec3.cross(other.getLinearVec3());
    res.getAngularVec3() = this->linearVec3.cross(other.getLinearVec3()) + this->angularVec3.cross(other.getAngularVec3());

    return res;
}